

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloomFilterTest.cpp
# Opt level: O2

BloomFilter<supermap::Key<1UL>_> *
getFilterWithErrorProbability<1ul>
          (BloomFilter<supermap::Key<1UL>_> *__return_storage_ptr__,double errorProbability)

{
  pointer *__ptr;
  _Head_base<0UL,_supermap::Hasher_*,_false> local_28;
  double local_20;
  Hasher *local_18;
  
  local_20 = errorProbability;
  std::make_unique<supermap::XXHasher>();
  local_28._M_head_impl = local_18;
  supermap::BloomFilter<supermap::Key<1UL>_>::BloomFilter
            (__return_storage_ptr__,local_20,
             (unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *)&local_28);
  if (local_28._M_head_impl != (Hasher *)0x0) {
    (*((local_28._M_head_impl)->super_Cloneable<supermap::Hasher>)._vptr_Cloneable[2])();
  }
  return __return_storage_ptr__;
}

Assistant:

supermap::BloomFilter<supermap::Key<Len>> getFilterWithErrorProbability(double errorProbability) {
    std::unique_ptr<supermap::Hasher> hasher = std::make_unique<supermap::XXHasher>();
    return supermap::BloomFilter<supermap::Key<Len>>(errorProbability, std::move(hasher));
}